

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sha3_prov.c
# Opt level: O0

int keccak_final(void *vctx,uchar *out,size_t *outl,size_t outsz)

{
  int iVar1;
  long in_RCX;
  undefined8 *in_RDX;
  undefined8 in_RSI;
  long in_RDI;
  KECCAK1600_CTX *ctx;
  int ret;
  undefined4 local_2c;
  undefined4 local_4;
  
  local_2c = 1;
  iVar1 = ossl_prov_is_running();
  if (iVar1 == 0) {
    local_4 = 0;
  }
  else {
    if (in_RCX != 0) {
      local_2c = (**(code **)(in_RDI + 0x198))(in_RSI,in_RDI);
    }
    *in_RDX = *(undefined8 *)(in_RDI + 0xd0);
    local_4 = local_2c;
  }
  return local_4;
}

Assistant:

static int keccak_final(void *vctx, unsigned char *out, size_t *outl,
                        size_t outsz)
{
    int ret = 1;
    KECCAK1600_CTX *ctx = vctx;

    if (!ossl_prov_is_running())
        return 0;
    if (outsz > 0)
        ret = ctx->meth.final(out, ctx);

    *outl = ctx->md_size;
    return ret;
}